

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void test_samplers(void)

{
  float local_7c;
  float local_78;
  float y;
  float x;
  int i;
  Sampler s;
  
  create_samplers((Sampler *)&x,1);
  for (y = 0.0; (int)y < 2; y = (float)((int)y + 1)) {
    sample_unit_square((Sampler *)&x,&local_78,&local_7c,(float *)0x0);
    printf("%f %f\n",(double)local_78,(double)local_7c);
  }
  return;
}

Assistant:

void test_samplers() {
    Sampler s;
    create_samplers(&s, 1);
    for (int i = 0; i < 2 * STRATIFIED_RESOLUTION * STRATIFIED_RESOLUTION; i++) {
        float x, y;
        sample_unit_square(&s, &x, &y, NULL);
        printf("%f %f\n", x, y);
    }
}